

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::init_ssl(torrent *this,string_view cert)

{
  int *piVar1;
  SSL_CTX *ctx_00;
  _Head_base<0UL,_boost::asio::ssl::context_*,_false> __p;
  int iVar2;
  context *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_STORE_CTX *pXVar3;
  error_code *in_R8;
  string_view pem;
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> ctx;
  error_code ec;
  _Head_base<0UL,_boost::asio::ssl::context_*,_false> local_78;
  error_code local_70;
  undefined1 local_60 [40];
  int64_t local_38;
  torrent *local_30;
  
  pem._M_len = cert._M_str;
  this_00 = (context *)operator_new(0x18);
  boost::asio::ssl::context::context(this_00,tls);
  pXVar3 = (X509_STORE_CTX *)0x82000850;
  local_78._M_head_impl = this_00;
  SSL_CTX_set_options(this_00->handle_);
  local_70.val_ = 0;
  local_70.failed_ = false;
  local_70.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  ctx_00 = (SSL_CTX *)(local_78._M_head_impl)->handle_;
  iVar2 = SSL_CTX_get_verify_callback((int)ctx_00,pXVar3);
  SSL_CTX_set_verify(ctx_00,7,(callback *)CONCAT44(extraout_var,iVar2));
  local_70.val_ = 0;
  local_70.failed_ = false;
  local_70.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_60._32_8_ = verify_peer_cert;
  local_38 = 0;
  local_30 = this;
  boost::asio::ssl::context::
  set_verify_callback<std::_Bind<bool(libtorrent::aux::torrent::*(libtorrent::aux::torrent*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,boost::asio::ssl::verify_context&)>>
            (local_78._M_head_impl,
             (_Bind<bool_(libtorrent::aux::torrent::*(libtorrent::aux::torrent_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_boost::asio::ssl::verify_context_&)>
              *)(local_60 + 0x20),&local_70);
  if (local_70.failed_ == false) {
    pem._M_str = (char *)&local_70;
    aux::ssl::set_trust_certificate
              ((ssl *)(local_78._M_head_impl)->handle_,(native_context_type)cert._M_len,pem,in_R8);
    __p._M_head_impl = local_78._M_head_impl;
    if (local_70.failed_ != true) {
      local_78._M_head_impl = (context *)0x0;
      ::std::
      __uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
      reset((__uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             *)&this->m_ssl_ctx,__p._M_head_impl);
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_60);
      alert_manager::emplace_alert<libtorrent::torrent_need_cert_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_60);
      if ((piece_picker *)local_60._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar2 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar2 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar2 + -1;
        }
        if (iVar2 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
      goto LAB_0031c90c;
    }
  }
  set_error(this,&local_70,(file_index_t)0xfffffffd);
  pause(this);
LAB_0031c90c:
  ::std::unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
  ~unique_ptr((unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               *)&local_78);
  return;
}

Assistant:

void torrent::init_ssl(string_view cert)
	{
		// create the SSL context for this torrent. We need to
		// inject the root certificate, and no other, to
		// verify other peers against
		std::unique_ptr<ssl::context> ctx(std::make_unique<ssl::context>(ssl::context::tls));

		ctx->set_options(ssl::context::default_workarounds
			| ssl::context::no_sslv2
			| ssl::context::no_sslv3
			| ssl::context::single_dh_use);

		error_code ec;
		ctx->set_verify_mode(ssl::context::verify_peer
			| ssl::context::verify_fail_if_no_peer_cert
			| ssl::context::verify_client_once, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// the verification function verifies the distinguished name
		// of a peer certificate to make sure it matches the info-hash
		// of the torrent, or that it's a "star-cert"
		ctx->set_verify_callback(
				std::bind(&torrent::verify_peer_cert, this, _1, _2)
				, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// set the root certificate as trust
		ssl::set_trust_certificate(ctx->native_handle(), cert, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

#if 0
		char filename[100];
		std::snprintf(filename, sizeof(filename), "/tmp/%u.pem", random());
		FILE* f = fopen(filename, "w+");
		fwrite(cert.c_str(), cert.size(), 1, f);
		fclose(f);
		ctx->load_verify_file(filename);
#endif

		// if all went well, set the torrent ssl context to this one
		m_ssl_ctx = std::move(ctx);
		// tell the client we need a cert for this torrent
		alerts().emplace_alert<torrent_need_cert_alert>(get_handle());
	}